

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_64.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_rowcol_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  longlong lVar39;
  longlong lVar40;
  longlong lVar41;
  longlong lVar42;
  __m128i *palVar43;
  __m128i *palVar44;
  __m128i *palVar45;
  __m128i *palVar46;
  __m128i *palVar47;
  __m128i *palVar48;
  __m128i *palVar49;
  __m128i *palVar50;
  int iVar51;
  int iVar52;
  parasail_result_t *ppVar53;
  __m128i *ptr;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  int64_t *ptr_00;
  __m128i *palVar54;
  long *plVar55;
  uint uVar56;
  int iVar57;
  int32_t t;
  int iVar58;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ulong extraout_RDX_05;
  __m128i *col;
  int seglen;
  long extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  parasail_result_t *extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  long extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  parasail_result_t *extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  ulong extraout_XMM0_Qa_10;
  ulong extraout_XMM0_Qa_11;
  long extraout_XMM0_Qb;
  long lVar59;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  long extraout_XMM0_Qb_05;
  ulong uVar60;
  longlong extraout_XMM0_Qb_06;
  undefined1 extraout_XMM0 [16];
  undefined8 extraout_XMM0_Qb_07;
  ulong extraout_XMM0_Qb_08;
  ulong extraout_XMM0_Qb_09;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  __m128i alVar66;
  __m128i alVar67;
  __m128i alVar68;
  __m128i alVar69;
  __m128i c;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i b_14;
  __m128i b_15;
  __m128i b_16;
  __m128i b_17;
  __m128i b_18;
  __m128i b_19;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i a_14;
  __m128i a_15;
  __m128i a_16;
  __m128i a_17;
  __m128i a_18;
  __m128i a_19;
  __m128i alVar70;
  __m128i alVar71;
  __m128i alVar72;
  __m128i alVar73;
  long local_e50;
  ulong local_e48;
  long local_e40;
  long local_e38;
  longlong lStack_e28;
  __m128i vHL_2;
  __m128i vHS_2;
  __m128i vHM_2;
  __m128i vH_2;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i cond;
  __m128i case2_1;
  __m128i case1_1;
  int64_t tmp2;
  int64_t tmp_6;
  __m128i vHp;
  __m128i case2;
  __m128i case1;
  __m128i *tmp_5;
  __m128i *tmp_4;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vPS;
  __m128i *vPM;
  __m128i *vP;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_ext;
  __m128i vF;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_64_t e;
  __m128i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  __m128i vOne;
  __m128i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int64_t *boundary;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvHLLoad;
  __m128i *pvHLStore;
  __m128i *pvHSLoad;
  __m128i *pvHSStore;
  __m128i *pvHMLoad;
  __m128i *pvHMStore;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfileS;
  __m128i *vProfileM;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_a68;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  ulong local_b8;
  ulong uStack_b0;
  size_t len;
  ulong extraout_RDX_06;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_64",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile64).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_64",
            "profile->profile64.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_64",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_64",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_64","s2")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_64",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_64",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_rowcol_striped_profile_sse41_128_64",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar52 = profile->s1Len;
    local_a68 = iVar52 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar51 = (iVar52 + 1) / 2;
    iVar58 = (iVar52 + -1) % iVar51;
    iVar52 = ~((iVar52 + -1) / iVar51) + 2;
    pvVar4 = (profile->profile64).score;
    pvVar5 = (profile->profile64).matches;
    pvVar6 = (profile->profile64).similar;
    if (-open < ppVar3->min) {
      alVar73[1] = (long)open;
    }
    else {
      alVar73[1] = -(long)ppVar3->min;
    }
    ppVar53 = (parasail_result_t *)(alVar73[1] + -0x7fffffffffffffff);
    vSaturationCheckMax[1] = 0x7ffffffffffffffe - (long)ppVar3->max;
    seglen = gap;
    result = ppVar53;
    vSaturationCheckMax[0] = (longlong)ppVar53;
    _segNum = (parasail_profile_t *)parasail_result_new_rowcol3(iVar51 * 2,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x2810801;
      uVar56 = *(uint *)&_segNum->field_0xc | 0x40000;
      len = (size_t)uVar56;
      *(uint *)&_segNum->field_0xc = uVar56;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar51);
      pvHMStore = parasail_memalign___m128i(0x10,(long)iVar51);
      pvHMLoad = parasail_memalign___m128i(0x10,(long)iVar51);
      pvHSStore = parasail_memalign___m128i(0x10,(long)iVar51);
      pvHSLoad = parasail_memalign___m128i(0x10,(long)iVar51);
      pvHLStore = parasail_memalign___m128i(0x10,(long)iVar51);
      pvHLLoad = parasail_memalign___m128i(0x10,(long)iVar51);
      pvE = parasail_memalign___m128i(0x10,(long)iVar51);
      ptr = parasail_memalign___m128i(0x10,(long)iVar51);
      b = parasail_memalign___m128i(0x10,(long)iVar51);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar51);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar51);
      ptr_00 = parasail_memalign_int64_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHSLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLStore == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHLLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int64_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar72[0] = (long)iVar51;
        alVar72[1] = extraout_RDX;
        parasail_memset___m128i(pvHMLoad,alVar72,len);
        alVar66[0] = (long)iVar51;
        alVar66[1] = extraout_RDX_00;
        parasail_memset___m128i(pvHSLoad,alVar66,len);
        alVar67[0] = (long)iVar51;
        alVar67[1] = extraout_RDX_01;
        parasail_memset___m128i(pvHLLoad,alVar67,len);
        alVar68[0] = (long)iVar51;
        alVar68[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar68,len);
        alVar69[0] = (long)iVar51;
        alVar69[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,alVar69,len);
        c[0] = (ulong)iVar51;
        c[1] = extraout_RDX_04;
        col = b_01;
        parasail_memset___m128i(b_01,c,len);
        h.m[1]._4_4_ = 0;
        local_e48 = extraout_RDX_05;
        for (k = 0; k < iVar51; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 2; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            uVar56 = h.m[1]._0_4_ * iVar51 + k;
            local_e48 = (ulong)uVar56;
            local_e40 = (long)(int)(-(gap * uVar56) - open);
            local_e38 = local_e40;
            if (local_e40 < -0x8000000000000000) {
              local_e38 = -0x8000000000000000;
            }
            *(long *)((long)&e + (long)(int)h.m[1]._0_4_ * 8 + 8) = local_e38;
            local_e40 = local_e40 - open;
            if (local_e40 < -0x8000000000000000) {
              local_e40 = -0x8000000000000000;
            }
            (&tmp)[(int)h.m[1]._0_4_] = local_e40;
          }
          pvHLoad[(int)h.m[1]._4_4_][0] = e.m[1];
          pvHLoad[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          local_e48 = (ulong)(-(gap * (k + -1)) - open);
          if ((long)local_e48 < -0x8000000000000000) {
            local_e48 = 0x8000000000000000;
          }
          ptr_00[k] = local_e48;
        }
        for (s1Len = 0; palVar50 = pvHLoad, palVar49 = pvHMStore, palVar48 = pvHMLoad,
            palVar47 = pvHSStore, palVar46 = pvHSLoad, palVar45 = pvHLStore, palVar44 = pvHLLoad,
            palVar43 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          stack0xfffffffffffff378 = ZEXT816(0);
          stack0xfffffffffffff368 = ZEXT816(0);
          vFL[0] = 1;
          vH[1] = 1;
          vH[0] = pvHLoad[iVar51 + -1][0];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = pvHMLoad[iVar51 + -1][0];
          stack0xfffffffffffff328 = (__m128i)(auVar63 << 0x40);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = pvHSLoad[iVar51 + -1][0];
          stack0xfffffffffffff318 = (__m128i)(auVar64 << 0x40);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = pvHLLoad[iVar51 + -1][0];
          _vP = (__m128i)(auVar65 << 0x40);
          vH_dag[1] = ptr_00[s1Len];
          iVar57 = ppVar3->mapper[(byte)s2[s1Len]] * iVar51;
          iVar1 = ppVar3->mapper[(byte)s2[s1Len]];
          c[0] = (ulong)s1Len;
          vH_03[0] = (ulong)(byte)s2[c[0]];
          iVar2 = ppVar3->mapper[vH_03[0]];
          pvHMStore = pvHLoad;
          pvHLoad = palVar49;
          pvHSStore = pvHMLoad;
          pvHMLoad = palVar47;
          pvHLStore = pvHSLoad;
          pvHSLoad = palVar45;
          pvE = pvHLLoad;
          pvHLLoad = palVar43;
          vF_ext[1] = (longlong)ppVar53;
          vF[0] = (longlong)ppVar53;
          for (k = 0; k < iVar51; k = k + 1) {
            alVar68 = b[k];
            alVar72 = b[k];
            alVar69 = b_00[k];
            alVar66 = b_00[k];
            palVar54 = b_01 + k;
            alVar73[1] = (*palVar54)[0];
            b_11[1] = (*palVar54)[1];
            alVar67 = *palVar54;
            alVar71[1] = (long)k * 0x10;
            plVar55 = (long *)((long)pvVar4 + alVar71[1] + (long)iVar57 * 0x10);
            b_02[1] = *plVar55;
            b_18[1] = plVar55[1];
            alVar71[0] = vH_03[0];
            a[1] = c[0];
            a[0] = (longlong)col;
            alVar70 = _mm_max_epi64_rpl(a,alVar71);
            alVar70[0] = alVar70[1];
            alVar70[1] = alVar71[1];
            a_00[1] = c[0];
            a_00[0] = (longlong)col;
            alVar71 = _mm_max_epi64_rpl(a_00,alVar70);
            b_02[0] = alVar71[1];
            palVar49[k][0] = extraout_XMM0_Qa;
            palVar49[k][1] = extraout_XMM0_Qb;
            b_02[1] = -(ulong)(extraout_XMM0_Qa == vH_dag[1] + b_02[1]);
            alVar71[1] = -(ulong)(extraout_XMM0_Qb == vH[0] + b_18[1]);
            b_18[1] = -(ulong)(extraout_XMM0_Qa == vF_ext[1]);
            lVar59 = -(ulong)(extraout_XMM0_Qb == vF[0]);
            auVar31._8_8_ = lVar59;
            auVar31._0_8_ = b_18[1];
            auVar63 = pblendvb((undefined1  [16])alVar72,stack0xfffffffffffff378,auVar31);
            plVar55 = (long *)((long)pvVar5 + (long)k * 0x10 + (long)(iVar1 * iVar51) * 0x10);
            auVar30._8_8_ = vHM[0] + plVar55[1];
            auVar30._0_8_ = vHS[1] + *plVar55;
            auVar29._8_8_ = alVar71[1];
            auVar29._0_8_ = b_02[1];
            auVar63 = pblendvb(auVar63,auVar30,auVar29);
            vHS[1] = auVar63._0_8_;
            vHM[0] = auVar63._8_8_;
            palVar47[k][0] = vHS[1];
            palVar47[k][1] = vHM[0];
            auVar28._8_8_ = lVar59;
            auVar28._0_8_ = b_18[1];
            auVar64 = pblendvb((undefined1  [16])alVar66,stack0xfffffffffffff368,auVar28);
            plVar55 = (long *)((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar51) * 0x10);
            auVar27._8_8_ = vHS[0] + plVar55[1];
            auVar27._0_8_ = vHL[1] + *plVar55;
            auVar26._8_8_ = alVar71[1];
            auVar26._0_8_ = b_02[1];
            auVar64 = pblendvb(auVar64,auVar27,auVar26);
            vHL[1] = auVar64._0_8_;
            vHS[0] = auVar64._8_8_;
            palVar45[k][0] = vHL[1];
            palVar45[k][1] = vHS[0];
            auVar25._8_8_ = lVar59;
            auVar25._0_8_ = b_18[1];
            auVar65 = pblendvb((undefined1  [16])alVar67,stack0xfffffffffffff358,auVar25);
            auVar24._8_8_ = vHL[0] + 1;
            auVar24._0_8_ = (undefined1 *)((long)*vP + 1);
            auVar23._8_8_ = alVar71[1];
            auVar23._0_8_ = b_02[1];
            auVar65 = pblendvb(auVar65,auVar24,auVar23);
            b_02[1] = (long)k * 0x10;
            vP = auVar65._0_8_;
            vHL[0] = auVar65._8_8_;
            palVar43[k][0] = (longlong)vP;
            palVar43[k][1] = vHL[0];
            a_01[1] = c[0];
            a_01[0] = (longlong)col;
            alVar72 = _mm_min_epi64_rpl(a_01,b_02);
            b_03[0] = alVar72[1];
            b_03[1] = b_02[1];
            a_02[1] = c[0];
            a_02[0] = (longlong)col;
            vSaturationCheckMax[1] = extraout_XMM0_Qa_00;
            alVar72 = _mm_max_epi64_rpl(a_02,b_03);
            b_04[0] = alVar72[1];
            b_04[1] = b_02[1];
            a_03[1] = c[0];
            a_03[0] = (longlong)col;
            alVar72 = _mm_max_epi64_rpl(a_03,b_04);
            b_05[0] = alVar72[1];
            b_05[1] = b_02[1];
            a_04[1] = c[0];
            a_04[0] = (longlong)col;
            alVar72 = _mm_max_epi64_rpl(a_04,b_05);
            b_06[0] = alVar72[1];
            b_06[1] = b_02[1];
            a_05[1] = c[0];
            a_05[0] = (longlong)col;
            alVar72 = _mm_max_epi64_rpl(a_05,b_06);
            b_07[0] = alVar72[1];
            b_07[1] = b_02[1];
            a_06[1] = c[0];
            a_06[0] = (longlong)col;
            result = extraout_XMM0_Qa_01;
            vSaturationCheckMax[0] = extraout_XMM0_Qb_00;
            alVar72 = _mm_max_epi64_rpl(a_06,b_07);
            b_08[0] = alVar72[1];
            b_08[1] = b_02[1];
            a_07[1] = c[0];
            a_07[0] = (longlong)col;
            alVar72 = _mm_cmpgt_epi64_rpl(a_07,b_08);
            alVar73[0] = alVar72[1];
            auVar22._8_8_ = extraout_XMM0_Qb_02;
            auVar22._0_8_ = extraout_XMM0_Qa_03;
            auVar65 = pblendvb((undefined1  [16])alVar68,auVar63,auVar22);
            auVar21._8_8_ = extraout_XMM0_Qb_02;
            auVar21._0_8_ = extraout_XMM0_Qa_03;
            auVar61 = pblendvb((undefined1  [16])alVar69,auVar64,auVar21);
            auVar20._8_8_ = b_11[1] + 1;
            auVar20._0_8_ = alVar73[1] + 1;
            auVar19._8_8_ = vHL[0] + 1;
            auVar19._0_8_ = (undefined1 *)((long)*vP + 1);
            auVar18._8_8_ = extraout_XMM0_Qb_02;
            auVar18._0_8_ = extraout_XMM0_Qa_03;
            auVar62 = pblendvb(auVar20,auVar19,auVar18);
            ptr[k][0] = extraout_XMM0_Qa_02;
            ptr[k][1] = extraout_XMM0_Qb_01;
            vES[1] = auVar65._0_8_;
            vEM[0] = auVar65._8_8_;
            b[k][0] = vES[1];
            b[k][1] = vEM[0];
            vEL[1] = auVar61._0_8_;
            vES[0] = auVar61._8_8_;
            b_00[k][0] = vEL[1];
            b_00[k][1] = vES[0];
            alVar73[1] = (long)k * 0x10;
            vF[1] = auVar62._0_8_;
            vEL[0] = auVar62._8_8_;
            b_01[k][0] = vF[1];
            b_01[k][1] = vEL[0];
            a_08[1] = c[0];
            a_08[0] = (longlong)col;
            alVar72 = _mm_max_epi64_rpl(a_08,alVar73);
            b_09[0] = alVar72[1];
            b_09[1] = alVar73[1];
            a_09[1] = c[0];
            a_09[0] = (longlong)col;
            alVar73 = _mm_cmpgt_epi64_rpl(a_09,b_09);
            vH_03[0] = alVar73[1];
            auVar17._8_8_ = extraout_XMM0_Qb_04;
            auVar17._0_8_ = extraout_XMM0_Qa_05;
            register0x00001240 = pblendvb(stack0xfffffffffffff378,auVar63,auVar17);
            auVar16._8_8_ = extraout_XMM0_Qb_04;
            auVar16._0_8_ = extraout_XMM0_Qa_05;
            register0x00001240 = pblendvb(stack0xfffffffffffff368,auVar64,auVar16);
            auVar15._8_8_ = vFL[0] + 1;
            auVar15._0_8_ = vH[1] + 1;
            auVar62._8_8_ = vHL[0] + 1;
            auVar62._0_8_ = (undefined1 *)((long)*vP + 1);
            auVar61._8_8_ = extraout_XMM0_Qb_04;
            auVar61._0_8_ = extraout_XMM0_Qa_05;
            register0x00001240 = pblendvb(auVar15,auVar62,auVar61);
            vH_dag[1] = palVar50[k][0];
            vH[0] = palVar50[k][1];
            unique0x10003240 = palVar48[k];
            unique0x10003250 = palVar46[k];
            _vP = palVar44[k];
            vF_ext[1] = extraout_XMM0_Qa_04;
            vF[0] = extraout_XMM0_Qb_03;
          }
          for (end_query = 0; end_query < 2; end_query = end_query + 1) {
            vHp[0] = palVar50[iVar51 + -1][0];
            local_e50 = ptr_00[s1Len + 1] - (long)open;
            if (local_e50 < -0x8000000000000000) {
              local_e50 = -0x8000000000000000;
            }
            vF[0] = vF_ext[1];
            auVar34._8_8_ = 0;
            auVar34._0_8_ = vFS[1];
            stack0xfffffffffffff378 = auVar34 << 0x40;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = vFL[1];
            stack0xfffffffffffff368 = auVar35 << 0x40;
            tmp_6 = ptr_00[s1Len];
            vF_ext[1] = local_e50;
            vFL[0] = vH[1];
            vH[1] = 1;
            for (k = 0; k < iVar51; k = k + 1) {
              plVar55 = (long *)((long)pvVar4 + (long)k * 0x10 + (long)iVar57 * 0x10);
              alVar73[1] = *plVar55;
              b_11[1] = plVar55[1];
              b_10[1] = (long)k * 0x10;
              b_10[0] = vH_03[0];
              a_10[1] = c[0];
              a_10[0] = (longlong)col;
              alVar72 = _mm_max_epi64_rpl(a_10,b_10);
              b_11[0] = alVar72[1];
              palVar49[k][0] = extraout_XMM0_Qa_06;
              palVar49[k][1] = extraout_XMM0_Qb_05;
              vH_03[0] = ~-(ulong)(extraout_XMM0_Qa_06 == tmp_6 + alVar73[1]) &
                         -(ulong)(extraout_XMM0_Qa_06 == vF_ext[1]);
              uVar60 = ~-(ulong)(extraout_XMM0_Qb_05 == vHp[0] + b_11[1]) &
                       -(ulong)(extraout_XMM0_Qb_05 == vF[0]);
              auVar14._8_8_ = uVar60;
              auVar14._0_8_ = vH_03[0];
              auVar63 = pblendvb((undefined1  [16])palVar47[k],stack0xfffffffffffff378,auVar14);
              vHS[1] = auVar63._0_8_;
              vHM[0] = auVar63._8_8_;
              palVar47[k][0] = vHS[1];
              palVar47[k][1] = vHM[0];
              auVar13._8_8_ = uVar60;
              auVar13._0_8_ = vH_03[0];
              auVar64 = pblendvb((undefined1  [16])palVar45[k],stack0xfffffffffffff368,auVar13);
              vHL[1] = auVar64._0_8_;
              vHS[0] = auVar64._8_8_;
              palVar45[k][0] = vHL[1];
              palVar45[k][1] = vHS[0];
              auVar12._8_8_ = uVar60;
              auVar12._0_8_ = vH_03[0];
              auVar65 = pblendvb((undefined1  [16])palVar43[k],stack0xfffffffffffff358,auVar12);
              b_11[1] = (long)k * 0x10;
              vP = auVar65._0_8_;
              vHL[0] = auVar65._8_8_;
              palVar43[k][0] = (longlong)vP;
              palVar43[k][1] = vHL[0];
              a_11[1] = c[0];
              a_11[0] = (longlong)col;
              alVar73 = _mm_min_epi64_rpl(a_11,b_11);
              b_12[0] = alVar73[1];
              b_12[1] = b_11[1];
              a_12[1] = c[0];
              a_12[0] = (longlong)col;
              vSaturationCheckMax[1] = extraout_XMM0_Qa_07;
              alVar73 = _mm_max_epi64_rpl(a_12,b_12);
              b_13[0] = alVar73[1];
              b_13[1] = b_11[1];
              a_13[1] = c[0];
              a_13[0] = (longlong)col;
              alVar73 = _mm_max_epi64_rpl(a_13,b_13);
              b_14[0] = alVar73[1];
              b_14[1] = b_11[1];
              a_14[1] = c[0];
              a_14[0] = (longlong)col;
              alVar73 = _mm_max_epi64_rpl(a_14,b_14);
              b_15[0] = alVar73[1];
              b_15[1] = b_11[1];
              a_15[1] = c[0];
              a_15[0] = (longlong)col;
              alVar73 = _mm_max_epi64_rpl(a_15,b_15);
              b_16[0] = alVar73[1];
              vF_ext[1] = vF_ext[1] - gap;
              vF[0] = vF[0] - gap;
              b_16[1] = b_11[1];
              a_16[1] = c[0];
              a_16[0] = (longlong)col;
              result = extraout_XMM0_Qa_08;
              vSaturationCheckMax[0] = extraout_XMM0_Qb_06;
              alVar73 = _mm_cmpgt_epi64_rpl(a_16,b_16);
              b_17[0] = alVar73[1];
              local_b8 = extraout_XMM0._0_8_;
              uStack_b0 = extraout_XMM0._8_8_;
              uStack_b0 = uStack_b0 | -(ulong)(vF[0] == extraout_XMM0_Qb_05 - open);
              auVar33._8_8_ = uStack_b0;
              auVar33._0_8_ = local_b8 | -(ulong)(vF_ext[1] == extraout_XMM0_Qa_06 - open);
              if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar33 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar33 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar33 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar33 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar33 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (uStack_b0 >> 7 & 1) == 0) && (uStack_b0 >> 0xf & 1) == 0) &&
                      (uStack_b0 >> 0x17 & 1) == 0) && (uStack_b0 >> 0x1f & 1) == 0) &&
                    (uStack_b0 >> 0x27 & 1) == 0) && (uStack_b0 >> 0x2f & 1) == 0) &&
                  (uStack_b0 >> 0x37 & 1) == 0) && -1 < (long)uStack_b0) goto LAB_00ae12dd;
              b_17[1] = b_11[1];
              a_17[1] = c[0];
              a_17[0] = (longlong)col;
              alVar73 = _mm_cmpgt_epi64_rpl(a_17,b_17);
              vH_03[0] = alVar73[1];
              auVar11._8_8_ = extraout_XMM0_Qb_07;
              auVar11._0_8_ = extraout_XMM0_Qa_09;
              register0x00001240 = pblendvb(stack0xfffffffffffff378,auVar63,auVar11);
              auVar10._8_8_ = extraout_XMM0_Qb_07;
              auVar10._0_8_ = extraout_XMM0_Qa_09;
              register0x00001240 = pblendvb(stack0xfffffffffffff368,auVar64,auVar10);
              auVar9._8_8_ = vFL[0] + 1;
              auVar9._0_8_ = vH[1] + 1;
              auVar8._8_8_ = vHL[0] + 1;
              auVar8._0_8_ = (undefined1 *)((long)*vP + 1);
              auVar7._8_8_ = extraout_XMM0_Qb_07;
              auVar7._0_8_ = extraout_XMM0_Qa_09;
              register0x00001240 = pblendvb(auVar9,auVar8,auVar7);
              tmp_6 = palVar50[k][0];
              vHp[0] = palVar50[k][1];
            }
          }
LAB_00ae12dd:
          vH_dag[1] = palVar49[iVar58][0];
          vH[0] = palVar49[iVar58][1];
          unique0x10003370 = palVar47[iVar58];
          unique0x10003380 = palVar45[iVar58];
          _vP = palVar43[iVar58];
          for (end_query = 0; lVar39 = vH_dag[1], end_query < iVar52; end_query = end_query + 1) {
            vH_dag[1] = 0;
            vH[0] = lVar39;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = vHS[1];
            stack0xfffffffffffff328 = (__m128i)(auVar36 << 0x40);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = vHL[1];
            stack0xfffffffffffff318 = (__m128i)(auVar37 << 0x40);
            auVar38._8_8_ = 0;
            auVar38._0_8_ = vP;
            _vP = (__m128i)(auVar38 << 0x40);
          }
          *(undefined4 *)
           (*((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->trace->
             trace_del_table + (long)s1Len * 4) = (undefined4)vH[0];
          *(undefined4 *)
           (*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            trace->trace_del_table + 8) + (long)s1Len * 4) = (undefined4)vHM[0];
          *(undefined4 *)
           (*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            trace->trace_del_table + 0x10) + (long)s1Len * 4) = (undefined4)vHS[0];
          local_e48 = vHL[0] & 0xffffffff;
          *(int *)(*(long *)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                   &_segNum->matrix)->trace->trace_del_table + 0x18) +
                  (long)s1Len * 4) = vP._8_4_;
        }
        for (k = 0; k < iVar51; k = k + 1) {
          t = k * 0x10;
          vH_00[0] = (ulong)(uint)k;
          vH_00[1]._0_4_ = iVar51;
          vH_00[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x20),vH_00,t,
                        seglen);
          vH_01[0] = (ulong)(uint)k;
          vH_01[1]._0_4_ = iVar51;
          vH_01[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x28),vH_01,t,
                        seglen);
          vH_02[0] = (ulong)(uint)k;
          vH_02[1]._0_4_ = iVar51;
          vH_02[1]._4_4_ = 0;
          arr_store_col(*(int **)((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)
                                        &_segNum->matrix)->trace->trace_del_table + 0x30),vH_02,t,
                        seglen);
          col = *(__m128i **)
                 ((long)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->trace->
                        trace_del_table + 0x38);
          vH_03[0] = (ulong)(uint)k;
          vH_03[1]._0_4_ = iVar51;
          vH_03[1]._4_4_ = 0;
          arr_store_col((int *)col,vH_03,t,seglen);
          local_e48 = extraout_RDX_06;
          c[0] = vH_03[0];
        }
        vHM_2[1] = pvHLoad[iVar58][0];
        vH_2[0] = pvHLoad[iVar58][1];
        vHS_2[1] = pvHMLoad[iVar58][0];
        vHM_2[0] = pvHMLoad[iVar58][1];
        vHL_2[1] = pvHSLoad[iVar58][0];
        vHS_2[0] = pvHSLoad[iVar58][1];
        b_18[1] = (long)iVar58 * 0x10;
        lStack_e28 = pvHLLoad[iVar58][0];
        vHL_2[0] = pvHLLoad[iVar58][1];
        for (end_query = 0; lVar42 = vHM_2[1], lVar41 = vHS_2[1], lVar40 = vHL_2[1],
            lVar39 = lStack_e28, end_query < iVar52; end_query = end_query + 1) {
          vHM_2[1] = 0;
          vH_2[0] = lVar42;
          vHS_2[1] = 0;
          vHM_2[0] = lVar41;
          vHL_2[1] = 0;
          vHS_2[0] = lVar40;
          lStack_e28 = 0;
          vHL_2[0] = lVar39;
        }
        matches._0_4_ = (int)vH_2[0];
        similar._0_4_ = (int)vHM_2[0];
        length._0_4_ = (int)vHS_2[0];
        vNegLimit[1]._0_4_ = (int)vHL_2[0];
        b_18[0] = local_e48;
        a_18[1] = c[0];
        a_18[0] = (longlong)col;
        alVar73 = _mm_cmplt_epi64_rpl(a_18,b_18);
        b_19[0] = alVar73[1];
        b_19[1] = b_18[1];
        a_19[1] = c[0];
        a_19[0] = (longlong)col;
        _mm_cmpgt_epi64_rpl(a_19,b_19);
        c[0] = extraout_XMM0_Qb_08 | extraout_XMM0_Qb_09;
        auVar32._8_8_ = c[0];
        auVar32._0_8_ = extraout_XMM0_Qa_10 | extraout_XMM0_Qa_11;
        if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (c[0] >> 7 & 1) != 0) || (c[0] >> 0xf & 1) != 0) || (c[0] >> 0x17 & 1) != 0) ||
               (c[0] >> 0x1f & 1) != 0) || (c[0] >> 0x27 & 1) != 0) || (c[0] >> 0x2f & 1) != 0) ||
            (c[0] >> 0x37 & 1) != 0) || (long)c[0] < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          matches._0_4_ = 0;
          similar._0_4_ = 0;
          length._0_4_ = 0;
          vNegLimit[1]._0_4_ = 0;
          local_a68 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)matches;
        *(int *)((long)&_segNum->s1 + 4) = local_a68;
        _segNum->s1Len = matrix._4_4_;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->matches =
             (int)similar;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->similar =
             (int)length;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->stats->length =
             (int)vNegLimit[1];
        parasail_free(ptr_00);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLLoad);
        parasail_free(pvHLStore);
        parasail_free(pvHSLoad);
        parasail_free(pvHSStore);
        parasail_free(pvHMLoad);
        parasail_free(pvHMStore);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 8);
                vHM = _mm_slli_si128 (vHM, 8);
                vHS = _mm_slli_si128 (vHS, 8);
                vHL = _mm_slli_si128 (vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
            vHM = _mm_slli_si128 (vHM, 8);
            vHS = _mm_slli_si128 (vHS, 8);
            vHL = _mm_slli_si128 (vHL, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}